

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

CK_RV __thiscall
Token::createToken(Token *this,ObjectStore *objectStore,ByteString *soPIN,CK_UTF8CHAR_PTR label)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  size_t sVar4;
  ObjectStoreToken *pOVar5;
  SecureDataManager *this_00;
  char *format;
  CK_RV CVar6;
  CK_ULONG flags;
  ByteString userPINBlob;
  MutexLocker lock;
  ByteString labelByteStr;
  ByteString soPINBlob;
  ulong local_160;
  ByteString local_158;
  MutexLocker local_130;
  ByteString local_120;
  undefined1 local_f8 [208];
  
  MutexLocker::MutexLocker(&local_130,this->tokenMutex);
  if (objectStore == (ObjectStore *)0x0) {
    CVar6 = 5;
    goto LAB_00172c08;
  }
  if (label == (CK_UTF8CHAR_PTR)0x0) {
    CVar6 = 7;
    goto LAB_00172c08;
  }
  ByteString::ByteString(&local_120,label,0x20);
  pOVar5 = this->token;
  if (pOVar5 == (ObjectStoreToken *)0x0) {
    SecureDataManager::SecureDataManager((SecureDataManager *)local_f8);
    bVar1 = SecureDataManager::setSOPIN((SecureDataManager *)local_f8,soPIN);
    if (bVar1) {
      pOVar5 = ObjectStore::newToken(objectStore,&local_120);
      if (pOVar5 == (ObjectStoreToken *)0x0) {
        format = "Could not create the token";
        iVar3 = 0x1af;
      }
      else {
        SecureDataManager::getSOPINBlob(&local_158,(SecureDataManager *)local_f8);
        iVar3 = (**pOVar5->_vptr_ObjectStoreToken)(pOVar5,&local_158);
        local_158._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_158.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
        if ((char)iVar3 != '\0') {
          this->token = pOVar5;
          CVar6 = 0x30;
          bVar1 = true;
          goto LAB_00172b43;
        }
        softHSMLog(3,"createToken",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                   ,0x1b6,"Failed to set SO PIN on new token");
        bVar1 = ObjectStore::destroyToken(objectStore,pOVar5);
        if (bVar1) {
          CVar6 = 0x30;
          goto LAB_00172a41;
        }
        format = "Failed to destroy incomplete token";
        iVar3 = 0x1ba;
      }
      CVar6 = 0x30;
      bVar1 = false;
      softHSMLog(3,"createToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                 ,iVar3,format);
    }
    else {
      CVar6 = 5;
LAB_00172a41:
      bVar1 = false;
    }
LAB_00172b43:
    SecureDataManager::~SecureDataManager((SecureDataManager *)local_f8);
    if (bVar1) {
LAB_00172b56:
      ByteString::ByteString((ByteString *)local_f8);
      ByteString::ByteString(&local_158);
      iVar3 = (*this->token->_vptr_ObjectStoreToken[1])(this->token,local_f8);
      if ((char)iVar3 == '\0') {
        uVar2 = false;
      }
      else {
        iVar3 = (*this->token->_vptr_ObjectStoreToken[3])(this->token,&local_158);
        uVar2 = (undefined1)iVar3;
      }
      this->valid = (bool)uVar2;
      if (this->sdm != (SecureDataManager *)0x0) {
        (*this->sdm->_vptr_SecureDataManager[1])();
      }
      this_00 = (SecureDataManager *)operator_new(0xd0);
      SecureDataManager::SecureDataManager(this_00,(ByteString *)local_f8,&local_158);
      this->sdm = this_00;
      local_158._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_158.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      local_f8._0_8_ = &PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)(local_f8 + 8));
      CVar6 = 0;
    }
  }
  else {
    iVar3 = (*pOVar5->_vptr_ObjectStoreToken[4])(pOVar5,&local_160);
    if ((char)iVar3 == '\0') {
      CVar6 = 5;
      softHSMLog(3,"createToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                 ,0x189,"Could not get the token flags");
    }
    else {
      SecureDataManager::getSOPINBlob((ByteString *)local_f8,this->sdm);
      sVar4 = ByteString::size((ByteString *)local_f8);
      if (sVar4 == 0) {
        local_f8._0_8_ = &PTR__ByteString_0019f880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)(local_f8 + 8));
      }
      else {
        bVar1 = SecureDataManager::loginSO(this->sdm,soPIN);
        local_f8._0_8_ = &PTR__ByteString_0019f880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)(local_f8 + 8));
        if (!bVar1) {
          local_160 = local_160 | 0x100000;
          (*this->token->_vptr_ObjectStoreToken[5])();
          CVar6 = 0xa0;
          softHSMLog(3,"createToken",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                     ,0x193,"Incorrect SO PIN");
          goto LAB_00172bef;
        }
      }
      local_160 = local_160 & 0xffffffffffefffff;
      (*this->token->_vptr_ObjectStoreToken[5])();
      iVar3 = (*this->token->_vptr_ObjectStoreToken[0x11])(this->token,&local_120);
      if ((char)iVar3 != '\0') goto LAB_00172b56;
      CVar6 = 0x30;
      softHSMLog(3,"createToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                 ,0x19c,"Could not reset the token");
    }
  }
LAB_00172bef:
  local_120._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_120.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
LAB_00172c08:
  MutexLocker::~MutexLocker(&local_130);
  return CVar6;
}

Assistant:

CK_RV Token::createToken(ObjectStore* objectStore, ByteString& soPIN, CK_UTF8CHAR_PTR label)
{
	CK_ULONG flags;

	// Lock access to the token
	MutexLocker lock(tokenMutex);

	if (objectStore == NULL) return CKR_GENERAL_ERROR;
	if (label == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Convert the label
	ByteString labelByteStr((const unsigned char*) label, 32);

	if (token != NULL)
	{
		// Get token flags
		if (!token->getTokenFlags(flags))
		{
			ERROR_MSG("Could not get the token flags");
			return CKR_GENERAL_ERROR;
		}

		// Verify SO PIN
		if (sdm->getSOPINBlob().size() > 0 && !sdm->loginSO(soPIN))
		{
			flags |= CKF_SO_PIN_COUNT_LOW;
			token->setTokenFlags(flags);

			ERROR_MSG("Incorrect SO PIN");
			return CKR_PIN_INCORRECT;
		}
		flags &= ~CKF_SO_PIN_COUNT_LOW;
		token->setTokenFlags(flags);

		// Reset the token
		if (!token->resetToken(labelByteStr))
		{
			ERROR_MSG("Could not reset the token");
			return CKR_DEVICE_ERROR;
		}
	}
	else
	{
		// Generate the SO PIN blob
		SecureDataManager soPINBlobGen;

		if (!soPINBlobGen.setSOPIN(soPIN))
		{
			return CKR_GENERAL_ERROR;
		}

		// Create the token
		ObjectStoreToken* newToken = objectStore->newToken(labelByteStr);

		if (newToken == NULL)
		{
			ERROR_MSG("Could not create the token");
			return CKR_DEVICE_ERROR;
		}

		// Set the SO PIN on the token
		if (!newToken->setSOPIN(soPINBlobGen.getSOPINBlob()))
		{
			ERROR_MSG("Failed to set SO PIN on new token");

			if (!objectStore->destroyToken(newToken))
			{
				ERROR_MSG("Failed to destroy incomplete token");
			}

			return CKR_DEVICE_ERROR;
		}

		token = newToken;
	}

	ByteString soPINBlob, userPINBlob;

	valid = token->getSOPIN(soPINBlob) && token->getUserPIN(userPINBlob);

	if (sdm != NULL) delete sdm;
	sdm = new SecureDataManager(soPINBlob, userPINBlob);

	return CKR_OK;
}